

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lambda_functions.hpp
# Opt level: O1

bool __thiscall duckdb::ListLambdaBindData::Equals(ListLambdaBindData *this,FunctionData *other_p)

{
  bool bVar1;
  
  bVar1 = Expression::Equals(&this->lambda_expr,
                             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                              *)(other_p + 4));
  if (((bVar1) &&
      (bVar1 = LogicalType::operator==(&this->return_type,(LogicalType *)(other_p + 1)), bVar1)) &&
     (this->has_index == (bool)*(char *)&other_p[5]._vptr_FunctionData)) {
    return this->has_initial == (bool)*(char *)((long)&other_p[5]._vptr_FunctionData + 1);
  }
  return false;
}

Assistant:

bool Equals(const FunctionData &other_p) const override {
		auto &other = other_p.Cast<ListLambdaBindData>();
		return Expression::Equals(lambda_expr, other.lambda_expr) && return_type == other.return_type &&
		       has_index == other.has_index && has_initial == other.has_initial;
	}